

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionElasticPdu.cpp
# Opt level: O0

bool __thiscall
DIS::CollisionElasticPdu::operator==(CollisionElasticPdu *this,CollisionElasticPdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  CollisionElasticPdu *rhs_local;
  CollisionElasticPdu *this_local;
  
  local_19 = EntityInformationFamilyPdu::operator==
                       (&this->super_EntityInformationFamilyPdu,
                        &rhs->super_EntityInformationFamilyPdu);
  bVar1 = EntityID::operator==(&this->_issuingEntityID,&rhs->_issuingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_collidingEntityID,&rhs->_collidingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EventIdentifier::operator==(&this->_collisionEventID,&rhs->_collisionEventID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_pad != rhs->_pad) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_contactVelocity,&rhs->_contactVelocity);
  if (!bVar1) {
    local_19 = false;
  }
  if ((this->_mass != rhs->_mass) || (NAN(this->_mass) || NAN(rhs->_mass))) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_locationOfImpact,&rhs->_locationOfImpact);
  if (!bVar1) {
    local_19 = false;
  }
  if ((this->_collisionIntermediateResultXX != rhs->_collisionIntermediateResultXX) ||
     (NAN(this->_collisionIntermediateResultXX) || NAN(rhs->_collisionIntermediateResultXX))) {
    local_19 = false;
  }
  if ((this->_collisionIntermediateResultXY != rhs->_collisionIntermediateResultXY) ||
     (NAN(this->_collisionIntermediateResultXY) || NAN(rhs->_collisionIntermediateResultXY))) {
    local_19 = false;
  }
  if ((this->_collisionIntermediateResultXZ != rhs->_collisionIntermediateResultXZ) ||
     (NAN(this->_collisionIntermediateResultXZ) || NAN(rhs->_collisionIntermediateResultXZ))) {
    local_19 = false;
  }
  if ((this->_collisionIntermediateResultYY != rhs->_collisionIntermediateResultYY) ||
     (NAN(this->_collisionIntermediateResultYY) || NAN(rhs->_collisionIntermediateResultYY))) {
    local_19 = false;
  }
  if ((this->_collisionIntermediateResultYZ != rhs->_collisionIntermediateResultYZ) ||
     (NAN(this->_collisionIntermediateResultYZ) || NAN(rhs->_collisionIntermediateResultYZ))) {
    local_19 = false;
  }
  if ((this->_collisionIntermediateResultZZ != rhs->_collisionIntermediateResultZZ) ||
     (NAN(this->_collisionIntermediateResultZZ) || NAN(rhs->_collisionIntermediateResultZZ))) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_unitSurfaceNormal,&rhs->_unitSurfaceNormal);
  if (!bVar1) {
    local_19 = false;
  }
  if ((this->_coefficientOfRestitution != rhs->_coefficientOfRestitution) ||
     (NAN(this->_coefficientOfRestitution) || NAN(rhs->_coefficientOfRestitution))) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool CollisionElasticPdu::operator ==(const CollisionElasticPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_issuingEntityID == rhs._issuingEntityID) ) ivarsEqual = false;
     if( ! (_collidingEntityID == rhs._collidingEntityID) ) ivarsEqual = false;
     if( ! (_collisionEventID == rhs._collisionEventID) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;
     if( ! (_contactVelocity == rhs._contactVelocity) ) ivarsEqual = false;
     if( ! (_mass == rhs._mass) ) ivarsEqual = false;
     if( ! (_locationOfImpact == rhs._locationOfImpact) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultXX == rhs._collisionIntermediateResultXX) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultXY == rhs._collisionIntermediateResultXY) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultXZ == rhs._collisionIntermediateResultXZ) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultYY == rhs._collisionIntermediateResultYY) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultYZ == rhs._collisionIntermediateResultYZ) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultZZ == rhs._collisionIntermediateResultZZ) ) ivarsEqual = false;
     if( ! (_unitSurfaceNormal == rhs._unitSurfaceNormal) ) ivarsEqual = false;
     if( ! (_coefficientOfRestitution == rhs._coefficientOfRestitution) ) ivarsEqual = false;

    return ivarsEqual;
 }